

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O1

void __thiscall tcpp::Lexer::PushStream(Lexer *this,TInputStreamUniquePtr *stream)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  
  if ((stream->_M_t).
      super___uniq_ptr_impl<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>._M_t.
      super__Tuple_impl<0UL,_tcpp::IInputStream_*,_std::default_delete<tcpp::IInputStream>_>.
      super__Head_base<0UL,_tcpp::IInputStream_*,_false>._M_head_impl != (IInputStream *)0x0) {
    puVar2 = (this->mStreamsContext).c.
             super__Deque_base<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>,_std::allocator<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->mStreamsContext).c.
                  super__Deque_base<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>,_std::allocator<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>,std::allocator<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>>
      ::
      _M_push_back_aux<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>
                ((deque<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>,std::allocator<std::unique_ptr<tcpp::IInputStream,std::default_delete<tcpp::IInputStream>>>>
                  *)&this->mStreamsContext,stream);
    }
    else {
      (puVar2->_M_t).
      super___uniq_ptr_impl<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>._M_t.
      super__Tuple_impl<0UL,_tcpp::IInputStream_*,_std::default_delete<tcpp::IInputStream>_>.
      super__Head_base<0UL,_tcpp::IInputStream_*,_false>._M_head_impl =
           (stream->_M_t).
           super___uniq_ptr_impl<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>._M_t.
           super__Tuple_impl<0UL,_tcpp::IInputStream_*,_std::default_delete<tcpp::IInputStream>_>.
           super__Head_base<0UL,_tcpp::IInputStream_*,_false>._M_head_impl;
      (stream->_M_t).
      super___uniq_ptr_impl<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>._M_t.
      super__Tuple_impl<0UL,_tcpp::IInputStream_*,_std::default_delete<tcpp::IInputStream>_>.
      super__Head_base<0UL,_tcpp::IInputStream_*,_false>._M_head_impl = (IInputStream *)0x0;
      piVar1 = &(this->mStreamsContext).c.
                super__Deque_base<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>,_std::allocator<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_c_cmakelists/bnoazx005[P]tcpp/tests/../source/tcppLibrary.hpp"
                ,0x224,"void tcpp::Lexer::PushStream(TInputStreamUniquePtr)");
}

Assistant:

void Lexer::PushStream(TInputStreamUniquePtr stream) TCPP_NOEXCEPT
	{
		TCPP_ASSERT(stream);

		if (!stream)
		{
			return;
		}

		mStreamsContext.push(std::move(stream));
	}